

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O1

bool __thiscall duckdb::CSVErrorHandler::CanGetLine(CSVErrorHandler *this,idx_t boundary_index)

{
  ulong uVar1;
  __node_base_ptr p_Var2;
  _Hash_node_base *p_Var3;
  __node_base_ptr p_Var4;
  ulong uVar5;
  __node_base_ptr p_Var6;
  _Hash_node_base *p_Var7;
  bool bVar8;
  
  bVar8 = boundary_index == 0;
  if (!bVar8) {
    uVar1 = (this->lines_per_batch_map)._M_h._M_bucket_count;
    p_Var7 = (_Hash_node_base *)0x0;
    do {
      uVar5 = (ulong)p_Var7 % uVar1;
      p_Var2 = (this->lines_per_batch_map)._M_h._M_buckets[uVar5];
      p_Var4 = (__node_base_ptr)0x0;
      if ((p_Var2 != (__node_base_ptr)0x0) &&
         (p_Var4 = p_Var2, p_Var6 = p_Var2->_M_nxt, p_Var7 != p_Var2->_M_nxt[1]._M_nxt)) {
        while (p_Var3 = p_Var6->_M_nxt, p_Var3 != (_Hash_node_base *)0x0) {
          p_Var4 = (__node_base_ptr)0x0;
          if (((ulong)p_Var3[1]._M_nxt % uVar1 != uVar5) ||
             (p_Var4 = p_Var6, p_Var6 = p_Var3, p_Var7 == p_Var3[1]._M_nxt)) goto LAB_016a3cc9;
        }
        p_Var4 = (__node_base_ptr)0x0;
      }
LAB_016a3cc9:
      if (p_Var4 == (__node_base_ptr)0x0) {
        return bVar8;
      }
      if (p_Var4->_M_nxt == (_Hash_node_base *)0x0) {
        return bVar8;
      }
      p_Var7 = (_Hash_node_base *)((long)&p_Var7->_M_nxt + 1);
      bVar8 = boundary_index <= p_Var7;
    } while (p_Var7 != (_Hash_node_base *)boundary_index);
  }
  return bVar8;
}

Assistant:

bool CSVErrorHandler::CanGetLine(idx_t boundary_index) {
	for (idx_t i = 0; i < boundary_index; i++) {
		if (lines_per_batch_map.find(i) == lines_per_batch_map.end()) {
			return false;
		}
	}
	return true;
}